

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parse_parent_address(char *address)

{
  undefined2 uVar1;
  undefined4 uVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  key_type local_20;
  
  pmVar4 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&global_map_id);
  parse_address(address,pmVar4);
  iVar3 = global_map_id;
  pmVar4 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&global_map_id);
  uVar1 = pmVar4->sin_port;
  uVar2 = pmVar4->sin_addr;
  local_20.first = uVar2;
  local_20.second = uVar1;
  pmVar5 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&local_20);
  *pmVar5 = iVar3;
  id_parent = global_map_id;
  global_map_id = global_map_id + 1;
  return true;
}

Assistant:

bool parse_parent_address(char* address) {
    parse_address(address, connections[global_map_id]);
    idconnections[get_ip_port(connections[global_map_id])] = global_map_id;
    id_parent = global_map_id;
    ++global_map_id;

    return true;
}